

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

bool __thiscall CNscPStackEntry::IsIntegerPowerOf2(CNscPStackEntry *this)

{
  bool bVar1;
  NscType NVar2;
  uint uVar3;
  CNscPStackEntry *in_RDI;
  uint nValue;
  bool local_1;
  
  bVar1 = IsSimpleConstant((CNscPStackEntry *)0x208518);
  if (bVar1) {
    NVar2 = GetType(in_RDI);
    if (NVar2 != NscType_Integer) {
      __assert_fail("GetType () == NscType_Integer",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                    ,0x1a2,"bool CNscPStackEntry::IsIntegerPowerOf2() const");
    }
    uVar3 = GetInteger(in_RDI);
    local_1 = (uVar3 & uVar3 - 1) == 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsIntegerPowerOf2 () const
	{
		unsigned int nValue;

		if (!IsSimpleConstant ())
			return false;

		assert (GetType () == NscType_Integer);
		nValue = (unsigned int) GetInteger ();

		return (nValue & (nValue - 1)) == 0;
	}